

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

GLFWjoystickfun glfwSetJoystickCallback(GLFWjoystickfun cbfun)

{
  GLFWbool GVar1;
  GLFWjoystickfun p_Var2;
  
  if (_glfw.initialized == 0) {
    p_Var2 = (GLFWjoystickfun)0x0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    if ((_glfw.joysticksInitialized == 0) && (GVar1 = (*_glfw.platform.initJoysticks)(), GVar1 == 0)
       ) {
      (*_glfw.platform.terminateJoysticks)();
      return (GLFWjoystickfun)0x0;
    }
    _glfw.joysticksInitialized = 1;
    p_Var2 = _glfw.callbacks.joystick;
    _glfw.callbacks.joystick = cbfun;
  }
  return p_Var2;
}

Assistant:

GLFWAPI GLFWjoystickfun glfwSetJoystickCallback(GLFWjoystickfun cbfun)
{
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!initJoysticks())
        return NULL;

    _GLFW_SWAP(GLFWjoystickfun, _glfw.callbacks.joystick, cbfun);
    return cbfun;
}